

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

int16_t target_pick(wchar_t y1,wchar_t x1,wchar_t dy,wchar_t dx,point_set *targets)

{
  wchar_t wVar1;
  int local_58;
  int local_54;
  int local_50;
  int local_48;
  wchar_t local_44;
  wchar_t b_v;
  wchar_t b_i;
  wchar_t y4;
  wchar_t x4;
  wchar_t y3;
  wchar_t x3;
  wchar_t y2;
  wchar_t x2;
  wchar_t v;
  wchar_t i;
  point_set *targets_local;
  wchar_t dx_local;
  wchar_t dy_local;
  wchar_t x1_local;
  wchar_t y1_local;
  
  local_44 = L'\xffffffff';
  local_48 = 9999;
  for (x2 = L'\0'; wVar1 = point_set_size((point_set_conflict *)targets), x2 < wVar1;
      x2 = x2 + L'\x01') {
    local_50 = targets->pts[x2].x - x1;
    local_54 = targets->pts[x2].y - y1;
    if (((dx == L'\0') || (0 < local_50 * dx)) && ((dy == L'\0' || (0 < local_54 * dy)))) {
      if (local_50 < 0) {
        local_50 = -local_50;
      }
      if (local_54 < 0) {
        local_54 = -local_54;
      }
      if ((((dy == L'\0') || (dx != L'\0')) || (local_50 <= local_54)) &&
         (((dx == L'\0' || (dy != L'\0')) || (local_54 <= local_50)))) {
        if (local_54 < local_50) {
          local_58 = local_50 * 2 + local_54;
        }
        else {
          local_58 = local_54 * 2 + local_50;
        }
        if ((local_44 < L'\0') || (local_58 < local_48)) {
          local_44 = x2;
          local_48 = local_58;
        }
      }
    }
  }
  return (int16_t)local_44;
}

Assistant:

int16_t target_pick(int y1, int x1, int dy, int dx, struct point_set *targets)
{
	int i, v;

	int x2, y2, x3, y3, x4, y4;

	int b_i = -1, b_v = 9999;


	/* Scan the locations */
	for (i = 0; i < point_set_size(targets); i++) {
		/* Point 2 */
		x2 = targets->pts[i].x;
		y2 = targets->pts[i].y;

		/* Directed distance */
		x3 = (x2 - x1);
		y3 = (y2 - y1);

		/* Verify quadrant */
		if (dx && (x3 * dx <= 0)) continue;
		if (dy && (y3 * dy <= 0)) continue;

		/* Absolute distance */
		x4 = ABS(x3);
		y4 = ABS(y3);

		/* Verify quadrant */
		if (dy && !dx && (x4 > y4)) continue;
		if (dx && !dy && (y4 > x4)) continue;

		/* Approximate Double Distance */
		v = ((x4 > y4) ? (x4 + x4 + y4) : (y4 + y4 + x4));

		/* Track best */
		if ((b_i >= 0) && (v >= b_v)) continue;

		/* Track best */
		b_i = i; b_v = v;
	}

	/* Result */
	return (b_i);
}